

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O1

int __thiscall Sequence::get_file_l2(Sequence *this)

{
  element_type *peVar1;
  long *plVar2;
  int l2cnt;
  int local_c;
  
  local_c = 0;
  peVar1 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (1 < peVar1->max_iset_len) {
    InvertDatabase::get_l2file
              ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &peVar1->it2f,'\0',&local_c);
  }
  peVar1 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (1 < peVar1->max_seq_len) {
    InvertDatabase::get_l2file
              ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &peVar1->seqf,'\x01',&local_c);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"L2 : ",5);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return local_c;
}

Assistant:

int get_file_l2() {
        int l2cnt = 0;

        if (args->max_iset_len > 1) {
            invdb->get_l2file(args->it2f, 0, l2cnt);
        }
        if (args->max_seq_len > 1) {
            invdb->get_l2file(args->seqf, 1, l2cnt);
        }

        cerr << "L2 : " << l2cnt << endl;
        return l2cnt;
    }